

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int str_gsub(lua_State *L)

{
  char cVar1;
  lua_State *L_00;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  char *s;
  char *pcVar6;
  lua_Integer lVar7;
  char *e;
  char *pcVar8;
  ulong uVar9;
  size_t srcl;
  size_t l;
  MatchState ms;
  luaL_Buffer b;
  
  s = luaL_checklstring(L,1,&srcl);
  pcVar6 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar4 = lua_type(L,3);
  lVar7 = luaL_optinteger(L,4,srcl + 1);
  cVar1 = *pcVar6;
  if (3 < iVar4 - 3U) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  luaL_buffinit(L,&b);
  ms.src_end = s + srcl;
  iVar4 = 0;
  ms.src_init = s;
  ms.L = L;
  do {
    e = s;
    if ((int)lVar7 <= iVar4) break;
    ms.level = 0;
    e = match(&ms,s,pcVar6 + (cVar1 == '^'));
    L_00 = ms.L;
    if (e == (char *)0x0) {
LAB_0011265c:
      e = s;
      if (ms.src_end <= s) break;
      if (&stack0xffffffffffffffd0 <= b.p) {
        luaL_prepbuffer(&b);
      }
      e = s + 1;
      *b.p = *s;
      b.p = b.p + 1;
    }
    else {
      iVar5 = lua_type(ms.L,3);
      if (iVar5 - 3U < 2) {
        pcVar8 = lua_tolstring(L_00,3,&l);
        for (uVar9 = 0; uVar9 < l; uVar9 = uVar9 + 1) {
          cVar2 = pcVar8[uVar9];
          if (cVar2 == '%') {
            bVar3 = pcVar8[uVar9 + 1];
            uVar9 = uVar9 + 1;
            if (bVar3 - 0x30 < 10) {
              if (bVar3 == 0x30) {
                luaL_addlstring(&b,s,(long)e - (long)s);
              }
              else {
                push_onecapture(&ms,(char)bVar3 + -0x31,s,e);
                luaL_addvalue(&b);
              }
            }
            else {
              if (&stack0xffffffffffffffd0 <= b.p) {
                luaL_prepbuffer(&b);
                bVar3 = pcVar8[uVar9];
              }
              *b.p = bVar3;
              b.p = (char *)((byte *)b.p + 1);
            }
          }
          else {
            if (&stack0xffffffffffffffd0 <= b.p) {
              luaL_prepbuffer(&b);
              cVar2 = pcVar8[uVar9];
            }
            *b.p = cVar2;
            b.p = b.p + 1;
          }
        }
      }
      else {
        if (iVar5 == 5) {
          push_onecapture(&ms,0,s,e);
          lua_gettable(L_00,3);
        }
        else if (iVar5 == 6) {
          lua_pushvalue(L_00,3);
          iVar5 = push_captures(&ms,s,e);
          lua_call(L_00,iVar5,1);
        }
        iVar5 = lua_toboolean(L_00,-1);
        if (iVar5 == 0) {
          lua_settop(L_00,-2);
          lua_pushlstring(L_00,s,(long)e - (long)s);
        }
        else {
          iVar5 = lua_isstring(L_00,-1);
          if (iVar5 == 0) {
            iVar5 = lua_type(L_00,-1);
            pcVar8 = lua_typename(L_00,iVar5);
            luaL_error(L_00,"invalid replacement value (a %s)",pcVar8);
          }
        }
        luaL_addvalue(&b);
      }
      iVar4 = iVar4 + 1;
      if (e <= s) goto LAB_0011265c;
    }
    s = e;
  } while (cVar1 != '^');
  luaL_addlstring(&b,e,(long)ms.src_end - (long)e);
  luaL_pushresult(&b);
  lua_pushinteger(L,(long)iVar4);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, srcl+1);
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}